

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O3

void cpsm::
     str_cat_impl<char_const*,bool,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
               (stringstream *ss,char **x,bool args,char *args_1,unsigned_long args_2,char *args_3,
               unsigned_long args_4,char *args_5,unsigned_long args_6,char *args_7,
               unsigned_long args_8,char *args_9,unsigned_long args_10,char *args_11,
               unsigned_long args_12,char *args_13,unsigned_long args_14)

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  char *local_38;
  
  __s = *x;
  poVar1 = (ostream *)(ss + 0x10);
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)poVar1 + -0x18) + (int)poVar1);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  local_38 = args_1;
  std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  str_cat_impl<char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
            (ss,&local_38,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10,args_11,
             args_12,args_13,args_14);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}